

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filterednormalizer2.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::FilteredNormalizer2::normalizeSecondAndAppend
          (FilteredNormalizer2 *this,UnicodeString *first,UnicodeString *second,UBool doNormalize,
          UErrorCode *errorCode)

{
  undefined4 uVar1;
  UBool UVar2;
  int iVar3;
  int32_t iVar4;
  undefined4 extraout_var;
  undefined1 local_118 [8];
  UnicodeString rest;
  UnicodeString middle;
  undefined1 local_80 [4];
  int32_t suffixStart;
  UnicodeString prefix;
  int32_t prefixLimit;
  UErrorCode *errorCode_local;
  UBool doNormalize_local;
  UnicodeString *second_local;
  UnicodeString *first_local;
  FilteredNormalizer2 *this_local;
  
  uprv_checkCanGetBuffer(first,errorCode);
  uprv_checkCanGetBuffer(second,errorCode);
  UVar2 = ::U_FAILURE(*errorCode);
  this_local = (FilteredNormalizer2 *)first;
  if (UVar2 == '\0') {
    if (first == second) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      UVar2 = UnicodeString::isEmpty(first);
      if (UVar2 == '\0') {
        prefix.fUnion._52_4_ = UnicodeSet::span(this->set,second,0,USET_SPAN_SIMPLE);
        if (prefix.fUnion._52_4_ != 0) {
          UnicodeString::tempSubString((UnicodeString *)local_80,second,0,prefix.fUnion._52_4_);
          iVar4 = UnicodeSet::spanBack(this->set,first,0x7fffffff,USET_SPAN_SIMPLE);
          if (iVar4 == 0) {
            if (doNormalize == '\0') {
              (*(this->norm2->super_UObject)._vptr_UObject[6])(this->norm2,first,local_80,errorCode)
              ;
            }
            else {
              (*(this->norm2->super_UObject)._vptr_UObject[5])(this->norm2,first,local_80,errorCode)
              ;
            }
          }
          else {
            UnicodeString::UnicodeString
                      ((UnicodeString *)((long)&rest.fUnion + 0x30),first,iVar4,0x7fffffff);
            if (doNormalize == '\0') {
              (*(this->norm2->super_UObject)._vptr_UObject[6])
                        (this->norm2,(undefined1 *)((long)&rest.fUnion + 0x30),local_80,errorCode);
            }
            else {
              (*(this->norm2->super_UObject)._vptr_UObject[5])
                        (this->norm2,(undefined1 *)((long)&rest.fUnion + 0x30),local_80,errorCode);
            }
            UnicodeString::replace
                      (first,iVar4,0x7fffffff,(UnicodeString *)((long)&rest.fUnion + 0x30));
            UnicodeString::~UnicodeString((UnicodeString *)((long)&rest.fUnion + 0x30));
          }
          UnicodeString::~UnicodeString((UnicodeString *)local_80);
        }
        uVar1 = prefix.fUnion._52_4_;
        iVar4 = UnicodeString::length(second);
        if ((int)uVar1 < iVar4) {
          UnicodeString::tempSubString
                    ((UnicodeString *)local_118,second,prefix.fUnion._52_4_,0x7fffffff);
          if (doNormalize == '\0') {
            UnicodeString::append(first,(UnicodeString *)local_118);
          }
          else {
            normalize(this,(UnicodeString *)local_118,first,USET_SPAN_NOT_CONTAINED,errorCode);
          }
          UnicodeString::~UnicodeString((UnicodeString *)local_118);
        }
      }
      else if (doNormalize == '\0') {
        this_local = (FilteredNormalizer2 *)UnicodeString::operator=(first,second);
      }
      else {
        iVar3 = (*(this->super_Normalizer2).super_UObject._vptr_UObject[3])
                          (this,second,first,errorCode);
        this_local = (FilteredNormalizer2 *)CONCAT44(extraout_var,iVar3);
      }
    }
  }
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString &
FilteredNormalizer2::normalizeSecondAndAppend(UnicodeString &first,
                                              const UnicodeString &second,
                                              UBool doNormalize,
                                              UErrorCode &errorCode) const {
    uprv_checkCanGetBuffer(first, errorCode);
    uprv_checkCanGetBuffer(second, errorCode);
    if(U_FAILURE(errorCode)) {
        return first;
    }
    if(&first==&second) {
        errorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return first;
    }
    if(first.isEmpty()) {
        if(doNormalize) {
            return normalize(second, first, errorCode);
        } else {
            return first=second;
        }
    }
    // merge the in-filter suffix of the first string with the in-filter prefix of the second
    int32_t prefixLimit=set.span(second, 0, USET_SPAN_SIMPLE);
    if(prefixLimit!=0) {
        UnicodeString prefix(second.tempSubString(0, prefixLimit));
        int32_t suffixStart=set.spanBack(first, INT32_MAX, USET_SPAN_SIMPLE);
        if(suffixStart==0) {
            if(doNormalize) {
                norm2.normalizeSecondAndAppend(first, prefix, errorCode);
            } else {
                norm2.append(first, prefix, errorCode);
            }
        } else {
            UnicodeString middle(first, suffixStart, INT32_MAX);
            if(doNormalize) {
                norm2.normalizeSecondAndAppend(middle, prefix, errorCode);
            } else {
                norm2.append(middle, prefix, errorCode);
            }
            first.replace(suffixStart, INT32_MAX, middle);
        }
    }
    if(prefixLimit<second.length()) {
        UnicodeString rest(second.tempSubString(prefixLimit, INT32_MAX));
        if(doNormalize) {
            normalize(rest, first, USET_SPAN_NOT_CONTAINED, errorCode);
        } else {
            first.append(rest);
        }
    }
    return first;
}